

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall Liby::http::HttpServer::handleAcceptEvent(HttpServer *this,Connection *conn)

{
  __shared_ptr<HttpContext,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<HttpContext>();
  std::__shared_ptr<Liby::BaseContext,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Liby::BaseContext,(__gnu_cxx::_Lock_policy)2> *)&conn->context_,&local_20
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void HttpServer::handleAcceptEvent(Connection &conn) {
    conn.context_ = std::make_shared<HttpContext>();
}